

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O1

void __thiscall dna_string::build_rank_support(dna_string *this)

{
  uint64_t *puVar1;
  int *piVar2;
  uint8_t *puVar3;
  pointer ppVar4;
  ulong uVar5;
  ulong uVar6;
  pointer ppVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint64_t uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  uint64_t uVar31;
  ushort uVar32;
  undefined1 auVar37 [12];
  int iVar41;
  uint uVar42;
  uint uVar54;
  undefined1 auVar43 [12];
  uint uVar55;
  undefined1 auVar48 [16];
  undefined1 auVar44 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar56;
  int iVar57;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [12];
  undefined1 auVar69 [16];
  undefined1 auVar65 [12];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  char cVar73;
  byte bVar81;
  char cVar82;
  byte bVar83;
  char cVar84;
  byte bVar85;
  char cVar86;
  byte bVar87;
  char cVar88;
  byte bVar89;
  undefined1 auVar74 [12];
  undefined1 auVar79 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined4 uVar33;
  undefined6 uVar34;
  undefined8 uVar35;
  undefined1 auVar36 [12];
  undefined1 auVar38 [14];
  undefined1 auVar39 [14];
  undefined1 auVar40 [16];
  undefined1 auVar45 [12];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined1 auVar53 [16];
  undefined1 auVar49 [16];
  undefined1 auVar58 [12];
  undefined1 auVar63 [16];
  undefined1 auVar66 [14];
  undefined1 auVar67 [14];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar75 [12];
  undefined1 auVar76 [14];
  undefined1 auVar77 [14];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  
  auVar14 = _DAT_0011d070;
  auVar13 = _DAT_0011d060;
  auVar12 = _DAT_0011d050;
  if (this->n_blocks == 1) {
    uVar28 = 0;
    uVar29 = 0;
    iVar24 = 0;
    iVar25 = 0;
    iVar26 = 0;
    iVar27 = 0;
    uVar30 = 0;
    uVar31 = 0;
    uVar18 = 0;
  }
  else {
    puVar3 = this->data;
    ppVar4 = (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar24 = 0;
    iVar25 = 0;
    iVar26 = 0;
    iVar27 = 0;
    uVar15 = 0;
    uVar28 = 0;
    uVar29 = 0;
    uVar30 = 0;
    uVar31 = 0;
    do {
      uVar18 = uVar15 >> 0x19;
      if ((uVar15 & 0x1ffffff) == 0) {
        ppVar7 = ppVar4 + uVar18;
        ppVar7->A = uVar28;
        ppVar7->C = uVar29;
        puVar1 = &ppVar4[uVar18].G;
        *puVar1 = uVar30;
        puVar1[1] = uVar31;
        iVar24 = 0;
        iVar25 = 0;
        iVar26 = 0;
        iVar27 = 0;
      }
      uVar17 = (ulong)(uint)((int)(uVar15 & 0x1ffffff) << 6);
      piVar2 = (int *)(puVar3 + uVar17 + 0x30 + uVar18 * 0x80000000);
      *piVar2 = iVar24;
      piVar2[1] = iVar25;
      piVar2[2] = iVar26;
      piVar2[3] = iVar27;
      uVar5 = *(ulong *)(puVar3 + uVar17 + 0x20 + uVar18 * 0x80000000);
      uVar20 = *(ulong *)(puVar3 + uVar17 + 0x28 + uVar18 * 0x80000000);
      uVar6 = *(ulong *)(puVar3 + uVar17 + 0x10 + uVar18 * 0x80000000);
      uVar22 = *(ulong *)(puVar3 + uVar17 + 0x18 + uVar18 * 0x80000000);
      uVar16 = *(ulong *)(puVar3 + uVar17 + uVar18 * 0x80000000);
      uVar18 = *(ulong *)(puVar3 + uVar17 + 8 + uVar18 * 0x80000000);
      uVar19 = ~(uVar18 | uVar20) & uVar22;
      uVar17 = uVar22 & uVar18 & ~uVar20;
      uVar21 = ~(uVar18 | uVar22) & ~uVar20;
      uVar18 = ~(uVar20 | uVar22) & uVar18;
      uVar23 = ~(uVar16 | uVar5) & uVar6;
      uVar20 = uVar6 & uVar16 & ~uVar5;
      uVar22 = ~(uVar16 | uVar6) & ~uVar5;
      uVar16 = ~(uVar5 | uVar6) & uVar16;
      auVar59._0_2_ = (ushort)uVar19 >> 1;
      auVar59._2_2_ = (ushort)(uVar19 >> 0x10) >> 1;
      auVar59._4_2_ = (ushort)(uVar19 >> 0x20) >> 1;
      auVar59._6_2_ = (ushort)(uVar19 >> 0x31);
      auVar59._8_2_ = (ushort)uVar17 >> 1;
      auVar59._10_2_ = (ushort)(uVar17 >> 0x10) >> 1;
      auVar59._12_2_ = (ushort)(uVar17 >> 0x20) >> 1;
      auVar59._14_2_ = (ushort)(uVar17 >> 0x31);
      auVar59 = auVar59 & auVar12;
      uVar32 = CONCAT11((char)(uVar19 >> 8) - auVar59[1],(char)uVar19 - auVar59[0]);
      uVar33 = CONCAT13((char)(uVar19 >> 0x18) - auVar59[3],
                        CONCAT12((char)(uVar19 >> 0x10) - auVar59[2],uVar32));
      uVar34 = CONCAT15((char)(uVar19 >> 0x28) - auVar59[5],
                        CONCAT14((char)(uVar19 >> 0x20) - auVar59[4],uVar33));
      uVar35 = CONCAT17((char)(uVar19 >> 0x38) - auVar59[7],
                        CONCAT16((char)(uVar19 >> 0x30) - auVar59[6],uVar34));
      auVar74._0_10_ =
           CONCAT19((char)(uVar17 >> 8) - auVar59[9],CONCAT18((char)uVar17 - auVar59[8],uVar35));
      auVar74[10] = (char)(uVar17 >> 0x10) - auVar59[10];
      auVar74[0xb] = (char)(uVar17 >> 0x18) - auVar59[0xb];
      auVar76[0xc] = (char)(uVar17 >> 0x20) - auVar59[0xc];
      auVar76._0_12_ = auVar74;
      auVar76[0xd] = (char)(uVar17 >> 0x28) - auVar59[0xd];
      auVar78[0xe] = (char)(uVar17 >> 0x30) - auVar59[0xe];
      auVar78._0_14_ = auVar76;
      auVar78[0xf] = (char)(uVar17 >> 0x38) - auVar59[0xf];
      auVar60 = auVar78 & auVar13;
      auVar79._0_2_ = uVar32 >> 2;
      auVar79._2_2_ = (ushort)((uint)uVar33 >> 0x12);
      auVar79._4_2_ = (ushort)((uint6)uVar34 >> 0x22);
      auVar79._6_2_ = (ushort)((ulong)uVar35 >> 0x32);
      auVar79._8_2_ = (ushort)((unkuint10)auVar74._0_10_ >> 0x42);
      auVar79._10_2_ = auVar74._10_2_ >> 2;
      auVar79._12_2_ = auVar76._12_2_ >> 2;
      auVar79._14_2_ = auVar78._14_2_ >> 2;
      auVar79 = auVar79 & auVar13;
      cVar73 = auVar79[0] + auVar60[0];
      bVar81 = auVar79[1] + auVar60[1];
      uVar32 = CONCAT11(bVar81,cVar73);
      cVar82 = auVar79[2] + auVar60[2];
      bVar83 = auVar79[3] + auVar60[3];
      uVar33 = CONCAT13(bVar83,CONCAT12(cVar82,uVar32));
      cVar84 = auVar79[4] + auVar60[4];
      bVar85 = auVar79[5] + auVar60[5];
      uVar34 = CONCAT15(bVar85,CONCAT14(cVar84,uVar33));
      cVar86 = auVar79[6] + auVar60[6];
      bVar87 = auVar79[7] + auVar60[7];
      uVar35 = CONCAT17(bVar87,CONCAT16(cVar86,uVar34));
      cVar88 = auVar79[8] + auVar60[8];
      bVar89 = auVar79[9] + auVar60[9];
      auVar75._0_10_ = CONCAT19(bVar89,CONCAT18(cVar88,uVar35));
      auVar75[10] = auVar79[10] + auVar60[10];
      auVar75[0xb] = auVar79[0xb] + auVar60[0xb];
      auVar77[0xc] = auVar79[0xc] + auVar60[0xc];
      auVar77._0_12_ = auVar75;
      auVar77[0xd] = auVar79[0xd] + auVar60[0xd];
      auVar80[0xe] = auVar79[0xe] + auVar60[0xe];
      auVar80._0_14_ = auVar77;
      auVar80[0xf] = auVar79[0xf] + auVar60[0xf];
      auVar90[0] = (char)(uVar32 >> 4) + cVar73;
      auVar90[1] = (bVar81 >> 4) + bVar81;
      auVar90[2] = (char)(ushort)((uint)uVar33 >> 0x14) + cVar82;
      auVar90[3] = (bVar83 >> 4) + bVar83;
      auVar90[4] = (char)(ushort)((uint6)uVar34 >> 0x24) + cVar84;
      auVar90[5] = (bVar85 >> 4) + bVar85;
      auVar90[6] = (char)(ushort)((ulong)uVar35 >> 0x34) + cVar86;
      auVar90[7] = (bVar87 >> 4) + bVar87;
      auVar90[8] = (char)(ushort)((unkuint10)auVar75._0_10_ >> 0x44) + cVar88;
      auVar90[9] = (bVar89 >> 4) + bVar89;
      auVar90[10] = (char)(auVar75._10_2_ >> 4) + auVar75[10];
      auVar90[0xb] = (auVar75[0xb] >> 4) + auVar75[0xb];
      auVar90[0xc] = (char)(auVar77._12_2_ >> 4) + auVar77[0xc];
      auVar90[0xd] = (auVar77[0xd] >> 4) + auVar77[0xd];
      auVar90[0xe] = (char)(auVar80._14_2_ >> 4) + auVar80[0xe];
      auVar90[0xf] = (auVar80[0xf] >> 4) + auVar80[0xf];
      auVar91 = psadbw(auVar90 & auVar14,(undefined1  [16])0x0);
      auVar61._0_2_ = (ushort)uVar21 >> 1;
      auVar61._2_2_ = (ushort)(uVar21 >> 0x10) >> 1;
      auVar61._4_2_ = (ushort)(uVar21 >> 0x20) >> 1;
      auVar61._6_2_ = (ushort)(uVar21 >> 0x31);
      auVar61._8_2_ = (ushort)uVar18 >> 1;
      auVar61._10_2_ = (ushort)(uVar18 >> 0x10) >> 1;
      auVar61._12_2_ = (ushort)(uVar18 >> 0x20) >> 1;
      auVar61._14_2_ = (ushort)(uVar18 >> 0x31);
      auVar61 = auVar61 & auVar12;
      uVar32 = CONCAT11((char)(uVar21 >> 8) - auVar61[1],(char)uVar21 - auVar61[0]);
      uVar33 = CONCAT13((char)(uVar21 >> 0x18) - auVar61[3],
                        CONCAT12((char)(uVar21 >> 0x10) - auVar61[2],uVar32));
      uVar34 = CONCAT15((char)(uVar21 >> 0x28) - auVar61[5],
                        CONCAT14((char)(uVar21 >> 0x20) - auVar61[4],uVar33));
      uVar35 = CONCAT17((char)(uVar21 >> 0x38) - auVar61[7],
                        CONCAT16((char)(uVar21 >> 0x30) - auVar61[6],uVar34));
      auVar64._0_10_ =
           CONCAT19((char)(uVar18 >> 8) - auVar61[9],CONCAT18((char)uVar18 - auVar61[8],uVar35));
      auVar64[10] = (char)(uVar18 >> 0x10) - auVar61[10];
      auVar64[0xb] = (char)(uVar18 >> 0x18) - auVar61[0xb];
      auVar66[0xc] = (char)(uVar18 >> 0x20) - auVar61[0xc];
      auVar66._0_12_ = auVar64;
      auVar66[0xd] = (char)(uVar18 >> 0x28) - auVar61[0xd];
      auVar68[0xe] = (char)(uVar18 >> 0x30) - auVar61[0xe];
      auVar68._0_14_ = auVar66;
      auVar68[0xf] = (char)(uVar18 >> 0x38) - auVar61[0xf];
      auVar60 = auVar68 & auVar13;
      auVar69._0_2_ = uVar32 >> 2;
      auVar69._2_2_ = (ushort)((uint)uVar33 >> 0x12);
      auVar69._4_2_ = (ushort)((uint6)uVar34 >> 0x22);
      auVar69._6_2_ = (ushort)((ulong)uVar35 >> 0x32);
      auVar69._8_2_ = (ushort)((unkuint10)auVar64._0_10_ >> 0x42);
      auVar69._10_2_ = auVar64._10_2_ >> 2;
      auVar69._12_2_ = auVar66._12_2_ >> 2;
      auVar69._14_2_ = auVar68._14_2_ >> 2;
      auVar69 = auVar69 & auVar13;
      cVar73 = auVar69[0] + auVar60[0];
      bVar81 = auVar69[1] + auVar60[1];
      uVar32 = CONCAT11(bVar81,cVar73);
      cVar82 = auVar69[2] + auVar60[2];
      bVar83 = auVar69[3] + auVar60[3];
      uVar33 = CONCAT13(bVar83,CONCAT12(cVar82,uVar32));
      cVar84 = auVar69[4] + auVar60[4];
      bVar85 = auVar69[5] + auVar60[5];
      uVar34 = CONCAT15(bVar85,CONCAT14(cVar84,uVar33));
      cVar86 = auVar69[6] + auVar60[6];
      bVar87 = auVar69[7] + auVar60[7];
      uVar35 = CONCAT17(bVar87,CONCAT16(cVar86,uVar34));
      cVar88 = auVar69[8] + auVar60[8];
      bVar89 = auVar69[9] + auVar60[9];
      auVar65._0_10_ = CONCAT19(bVar89,CONCAT18(cVar88,uVar35));
      auVar65[10] = auVar69[10] + auVar60[10];
      auVar65[0xb] = auVar69[0xb] + auVar60[0xb];
      auVar67[0xc] = auVar69[0xc] + auVar60[0xc];
      auVar67._0_12_ = auVar65;
      auVar67[0xd] = auVar69[0xd] + auVar60[0xd];
      auVar70[0xe] = auVar69[0xe] + auVar60[0xe];
      auVar70._0_14_ = auVar67;
      auVar70[0xf] = auVar69[0xf] + auVar60[0xf];
      auVar62[0] = (char)(uVar32 >> 4) + cVar73;
      auVar62[1] = (bVar81 >> 4) + bVar81;
      auVar62[2] = (char)(ushort)((uint)uVar33 >> 0x14) + cVar82;
      auVar62[3] = (bVar83 >> 4) + bVar83;
      auVar62[4] = (char)(ushort)((uint6)uVar34 >> 0x24) + cVar84;
      auVar62[5] = (bVar85 >> 4) + bVar85;
      auVar62[6] = (char)(ushort)((ulong)uVar35 >> 0x34) + cVar86;
      auVar62[7] = (bVar87 >> 4) + bVar87;
      auVar62[8] = (char)(ushort)((unkuint10)auVar65._0_10_ >> 0x44) + cVar88;
      auVar62[9] = (bVar89 >> 4) + bVar89;
      auVar62[10] = (char)(auVar65._10_2_ >> 4) + auVar65[10];
      auVar62[0xb] = (auVar65[0xb] >> 4) + auVar65[0xb];
      auVar62[0xc] = (char)(auVar67._12_2_ >> 4) + auVar67[0xc];
      auVar62[0xd] = (auVar67[0xd] >> 4) + auVar67[0xd];
      auVar62[0xe] = (char)(auVar70._14_2_ >> 4) + auVar70[0xe];
      auVar62[0xf] = (auVar70[0xf] >> 4) + auVar70[0xf];
      auVar60 = psadbw(auVar62 & auVar14,(undefined1  [16])0x0);
      sVar8 = auVar60._0_2_;
      sVar9 = auVar60._2_2_;
      sVar10 = auVar60._4_2_;
      sVar11 = auVar60._6_2_;
      iVar57 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar60[6] - (0xff < sVar11),
                        CONCAT12((0 < sVar10) * (sVar10 < 0x100) * auVar60[4] - (0xff < sVar10),
                                 CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar60[2] -
                                          (0xff < sVar9),
                                          (0 < sVar8) * (sVar8 < 0x100) * auVar60[0] -
                                          (0xff < sVar8))));
      sVar8 = auVar60._8_2_;
      sVar9 = auVar60._10_2_;
      sVar10 = auVar60._12_2_;
      sVar11 = auVar60._14_2_;
      auVar58._0_8_ =
           CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar60[0xe] - (0xff < sVar11),
                    CONCAT16((0 < sVar10) * (sVar10 < 0x100) * auVar60[0xc] - (0xff < sVar10),
                             CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar60[10] - (0xff < sVar9),
                                      CONCAT14((0 < sVar8) * (sVar8 < 0x100) * auVar60[8] -
                                               (0xff < sVar8),iVar57))));
      sVar8 = auVar91._0_2_;
      auVar58[8] = (0 < sVar8) * (sVar8 < 0x100) * auVar91[0] - (0xff < sVar8);
      sVar8 = auVar91._2_2_;
      auVar58[9] = (0 < sVar8) * (sVar8 < 0x100) * auVar91[2] - (0xff < sVar8);
      sVar8 = auVar91._4_2_;
      auVar58[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar91[4] - (0xff < sVar8);
      sVar8 = auVar91._6_2_;
      auVar58[0xb] = (0 < sVar8) * (sVar8 < 0x100) * auVar91[6] - (0xff < sVar8);
      sVar8 = auVar91._8_2_;
      auVar63[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar91[8] - (0xff < sVar8);
      auVar63._0_12_ = auVar58;
      sVar8 = auVar91._10_2_;
      auVar63[0xd] = (0 < sVar8) * (sVar8 < 0x100) * auVar91[10] - (0xff < sVar8);
      sVar8 = auVar91._12_2_;
      auVar63[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar91[0xc] - (0xff < sVar8);
      sVar8 = auVar91._14_2_;
      auVar63[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar91[0xe] - (0xff < sVar8);
      auVar71._0_2_ = (ushort)uVar23 >> 1;
      auVar71._2_2_ = (ushort)(uVar23 >> 0x10) >> 1;
      auVar71._4_2_ = (ushort)(uVar23 >> 0x20) >> 1;
      auVar71._6_2_ = (ushort)(uVar23 >> 0x31);
      auVar71._8_2_ = (ushort)uVar20 >> 1;
      auVar71._10_2_ = (ushort)(uVar20 >> 0x10) >> 1;
      auVar71._12_2_ = (ushort)(uVar20 >> 0x20) >> 1;
      auVar71._14_2_ = (ushort)(uVar20 >> 0x31);
      auVar71 = auVar71 & auVar12;
      uVar32 = CONCAT11((char)(uVar23 >> 8) - auVar71[1],(char)uVar23 - auVar71[0]);
      uVar33 = CONCAT13((char)(uVar23 >> 0x18) - auVar71[3],
                        CONCAT12((char)(uVar23 >> 0x10) - auVar71[2],uVar32));
      uVar34 = CONCAT15((char)(uVar23 >> 0x28) - auVar71[5],
                        CONCAT14((char)(uVar23 >> 0x20) - auVar71[4],uVar33));
      uVar35 = CONCAT17((char)(uVar23 >> 0x38) - auVar71[7],
                        CONCAT16((char)(uVar23 >> 0x30) - auVar71[6],uVar34));
      auVar43._0_10_ =
           CONCAT19((char)(uVar20 >> 8) - auVar71[9],CONCAT18((char)uVar20 - auVar71[8],uVar35));
      auVar43[10] = (char)(uVar20 >> 0x10) - auVar71[10];
      auVar43[0xb] = (char)(uVar20 >> 0x18) - auVar71[0xb];
      auVar46[0xc] = (char)(uVar20 >> 0x20) - auVar71[0xc];
      auVar46._0_12_ = auVar43;
      auVar46[0xd] = (char)(uVar20 >> 0x28) - auVar71[0xd];
      auVar51[0xe] = (char)(uVar20 >> 0x30) - auVar71[0xe];
      auVar51._0_14_ = auVar46;
      auVar51[0xf] = (char)(uVar20 >> 0x38) - auVar71[0xf];
      auVar60 = auVar51 & auVar13;
      auVar48._0_2_ = uVar32 >> 2;
      auVar48._2_2_ = (ushort)((uint)uVar33 >> 0x12);
      auVar48._4_2_ = (ushort)((uint6)uVar34 >> 0x22);
      auVar48._6_2_ = (ushort)((ulong)uVar35 >> 0x32);
      auVar48._8_2_ = (ushort)((unkuint10)auVar43._0_10_ >> 0x42);
      auVar48._10_2_ = auVar43._10_2_ >> 2;
      auVar48._12_2_ = auVar46._12_2_ >> 2;
      auVar48._14_2_ = auVar51._14_2_ >> 2;
      auVar48 = auVar48 & auVar13;
      cVar73 = auVar48[0] + auVar60[0];
      bVar81 = auVar48[1] + auVar60[1];
      uVar32 = CONCAT11(bVar81,cVar73);
      cVar82 = auVar48[2] + auVar60[2];
      bVar83 = auVar48[3] + auVar60[3];
      uVar33 = CONCAT13(bVar83,CONCAT12(cVar82,uVar32));
      cVar84 = auVar48[4] + auVar60[4];
      bVar85 = auVar48[5] + auVar60[5];
      uVar34 = CONCAT15(bVar85,CONCAT14(cVar84,uVar33));
      cVar86 = auVar48[6] + auVar60[6];
      bVar87 = auVar48[7] + auVar60[7];
      uVar35 = CONCAT17(bVar87,CONCAT16(cVar86,uVar34));
      cVar88 = auVar48[8] + auVar60[8];
      bVar89 = auVar48[9] + auVar60[9];
      auVar44._0_10_ = CONCAT19(bVar89,CONCAT18(cVar88,uVar35));
      auVar44[10] = auVar48[10] + auVar60[10];
      auVar44[0xb] = auVar48[0xb] + auVar60[0xb];
      auVar47[0xc] = auVar48[0xc] + auVar60[0xc];
      auVar47._0_12_ = auVar44;
      auVar47[0xd] = auVar48[0xd] + auVar60[0xd];
      auVar49[0xe] = auVar48[0xe] + auVar60[0xe];
      auVar49._0_14_ = auVar47;
      auVar49[0xf] = auVar48[0xf] + auVar60[0xf];
      auVar72[0] = (char)(uVar32 >> 4) + cVar73;
      auVar72[1] = (bVar81 >> 4) + bVar81;
      auVar72[2] = (char)(ushort)((uint)uVar33 >> 0x14) + cVar82;
      auVar72[3] = (bVar83 >> 4) + bVar83;
      auVar72[4] = (char)(ushort)((uint6)uVar34 >> 0x24) + cVar84;
      auVar72[5] = (bVar85 >> 4) + bVar85;
      auVar72[6] = (char)(ushort)((ulong)uVar35 >> 0x34) + cVar86;
      auVar72[7] = (bVar87 >> 4) + bVar87;
      auVar72[8] = (char)(ushort)((unkuint10)auVar44._0_10_ >> 0x44) + cVar88;
      auVar72[9] = (bVar89 >> 4) + bVar89;
      auVar72[10] = (char)(auVar44._10_2_ >> 4) + auVar44[10];
      auVar72[0xb] = (auVar44[0xb] >> 4) + auVar44[0xb];
      auVar72[0xc] = (char)(auVar47._12_2_ >> 4) + auVar47[0xc];
      auVar72[0xd] = (auVar47[0xd] >> 4) + auVar47[0xd];
      auVar72[0xe] = (char)(auVar49._14_2_ >> 4) + auVar49[0xe];
      auVar72[0xf] = (auVar49[0xf] >> 4) + auVar49[0xf];
      auVar48 = psadbw(auVar72 & auVar14,(undefined1  [16])0x0);
      auVar50._0_2_ = (ushort)uVar22 >> 1;
      auVar50._2_2_ = (ushort)(uVar22 >> 0x10) >> 1;
      auVar50._4_2_ = (ushort)(uVar22 >> 0x20) >> 1;
      auVar50._6_2_ = (ushort)(uVar22 >> 0x31);
      auVar50._8_2_ = (ushort)uVar16 >> 1;
      auVar50._10_2_ = (ushort)(uVar16 >> 0x10) >> 1;
      auVar50._12_2_ = (ushort)(uVar16 >> 0x20) >> 1;
      auVar50._14_2_ = (ushort)(uVar16 >> 0x31);
      auVar50 = auVar50 & auVar12;
      uVar32 = CONCAT11((char)(uVar22 >> 8) - auVar50[1],(char)uVar22 - auVar50[0]);
      uVar33 = CONCAT13((char)(uVar22 >> 0x18) - auVar50[3],
                        CONCAT12((char)(uVar22 >> 0x10) - auVar50[2],uVar32));
      uVar34 = CONCAT15((char)(uVar22 >> 0x28) - auVar50[5],
                        CONCAT14((char)(uVar22 >> 0x20) - auVar50[4],uVar33));
      uVar35 = CONCAT17((char)(uVar22 >> 0x38) - auVar50[7],
                        CONCAT16((char)(uVar22 >> 0x30) - auVar50[6],uVar34));
      auVar36._0_10_ =
           CONCAT19((char)(uVar16 >> 8) - auVar50[9],CONCAT18((char)uVar16 - auVar50[8],uVar35));
      auVar36[10] = (char)(uVar16 >> 0x10) - auVar50[10];
      auVar36[0xb] = (char)(uVar16 >> 0x18) - auVar50[0xb];
      auVar38[0xc] = (char)(uVar16 >> 0x20) - auVar50[0xc];
      auVar38._0_12_ = auVar36;
      auVar38[0xd] = (char)(uVar16 >> 0x28) - auVar50[0xd];
      auVar60[0xe] = (char)(uVar16 >> 0x30) - auVar50[0xe];
      auVar60._0_14_ = auVar38;
      auVar60[0xf] = (char)(uVar16 >> 0x38) - auVar50[0xf];
      auVar51 = auVar60 & auVar13;
      auVar91._0_2_ = uVar32 >> 2;
      auVar91._2_2_ = (ushort)((uint)uVar33 >> 0x12);
      auVar91._4_2_ = (ushort)((uint6)uVar34 >> 0x22);
      auVar91._6_2_ = (ushort)((ulong)uVar35 >> 0x32);
      auVar91._8_2_ = (ushort)((unkuint10)auVar36._0_10_ >> 0x42);
      auVar91._10_2_ = auVar36._10_2_ >> 2;
      auVar91._12_2_ = auVar38._12_2_ >> 2;
      auVar91._14_2_ = auVar60._14_2_ >> 2;
      auVar91 = auVar91 & auVar13;
      cVar73 = auVar91[0] + auVar51[0];
      bVar81 = auVar91[1] + auVar51[1];
      uVar32 = CONCAT11(bVar81,cVar73);
      cVar82 = auVar91[2] + auVar51[2];
      bVar83 = auVar91[3] + auVar51[3];
      uVar33 = CONCAT13(bVar83,CONCAT12(cVar82,uVar32));
      cVar84 = auVar91[4] + auVar51[4];
      bVar85 = auVar91[5] + auVar51[5];
      uVar34 = CONCAT15(bVar85,CONCAT14(cVar84,uVar33));
      cVar86 = auVar91[6] + auVar51[6];
      bVar87 = auVar91[7] + auVar51[7];
      uVar35 = CONCAT17(bVar87,CONCAT16(cVar86,uVar34));
      cVar88 = auVar91[8] + auVar51[8];
      bVar89 = auVar91[9] + auVar51[9];
      auVar37._0_10_ = CONCAT19(bVar89,CONCAT18(cVar88,uVar35));
      auVar37[10] = auVar91[10] + auVar51[10];
      auVar37[0xb] = auVar91[0xb] + auVar51[0xb];
      auVar39[0xc] = auVar91[0xc] + auVar51[0xc];
      auVar39._0_12_ = auVar37;
      auVar39[0xd] = auVar91[0xd] + auVar51[0xd];
      auVar40[0xe] = auVar91[0xe] + auVar51[0xe];
      auVar40._0_14_ = auVar39;
      auVar40[0xf] = auVar91[0xf] + auVar51[0xf];
      auVar52[0] = (char)(uVar32 >> 4) + cVar73;
      auVar52[1] = (bVar81 >> 4) + bVar81;
      auVar52[2] = (char)(ushort)((uint)uVar33 >> 0x14) + cVar82;
      auVar52[3] = (bVar83 >> 4) + bVar83;
      auVar52[4] = (char)(ushort)((uint6)uVar34 >> 0x24) + cVar84;
      auVar52[5] = (bVar85 >> 4) + bVar85;
      auVar52[6] = (char)(ushort)((ulong)uVar35 >> 0x34) + cVar86;
      auVar52[7] = (bVar87 >> 4) + bVar87;
      auVar52[8] = (char)(ushort)((unkuint10)auVar37._0_10_ >> 0x44) + cVar88;
      auVar52[9] = (bVar89 >> 4) + bVar89;
      auVar52[10] = (char)(auVar37._10_2_ >> 4) + auVar37[10];
      auVar52[0xb] = (auVar37[0xb] >> 4) + auVar37[0xb];
      auVar52[0xc] = (char)(auVar39._12_2_ >> 4) + auVar39[0xc];
      auVar52[0xd] = (auVar39[0xd] >> 4) + auVar39[0xd];
      auVar52[0xe] = (char)(auVar40._14_2_ >> 4) + auVar40[0xe];
      auVar52[0xf] = (auVar40[0xf] >> 4) + auVar40[0xf];
      auVar60 = psadbw(auVar52 & auVar14,(undefined1  [16])0x0);
      sVar8 = auVar60._0_2_;
      sVar9 = auVar60._2_2_;
      sVar10 = auVar60._4_2_;
      sVar11 = auVar60._6_2_;
      iVar41 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar60[6] - (0xff < sVar11),
                        CONCAT12((0 < sVar10) * (sVar10 < 0x100) * auVar60[4] - (0xff < sVar10),
                                 CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar60[2] -
                                          (0xff < sVar9),
                                          (0 < sVar8) * (sVar8 < 0x100) * auVar60[0] -
                                          (0xff < sVar8))));
      sVar8 = auVar60._8_2_;
      sVar9 = auVar60._10_2_;
      sVar10 = auVar60._12_2_;
      sVar11 = auVar60._14_2_;
      auVar45._0_8_ =
           CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar60[0xe] - (0xff < sVar11),
                    CONCAT16((0 < sVar10) * (sVar10 < 0x100) * auVar60[0xc] - (0xff < sVar10),
                             CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar60[10] - (0xff < sVar9),
                                      CONCAT14((0 < sVar8) * (sVar8 < 0x100) * auVar60[8] -
                                               (0xff < sVar8),iVar41))));
      sVar8 = auVar48._0_2_;
      auVar45[8] = (0 < sVar8) * (sVar8 < 0x100) * auVar48[0] - (0xff < sVar8);
      sVar8 = auVar48._2_2_;
      auVar45[9] = (0 < sVar8) * (sVar8 < 0x100) * auVar48[2] - (0xff < sVar8);
      sVar8 = auVar48._4_2_;
      auVar45[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar48[4] - (0xff < sVar8);
      sVar8 = auVar48._6_2_;
      auVar45[0xb] = (0 < sVar8) * (sVar8 < 0x100) * auVar48[6] - (0xff < sVar8);
      sVar8 = auVar48._8_2_;
      auVar53[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar48[8] - (0xff < sVar8);
      auVar53._0_12_ = auVar45;
      sVar8 = auVar48._10_2_;
      auVar53[0xd] = (0 < sVar8) * (sVar8 < 0x100) * auVar48[10] - (0xff < sVar8);
      sVar8 = auVar48._12_2_;
      auVar53[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar48[0xc] - (0xff < sVar8);
      sVar8 = auVar48._14_2_;
      auVar53[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar48[0xe] - (0xff < sVar8);
      uVar42 = iVar41 + iVar57;
      uVar54 = (int)((ulong)auVar45._0_8_ >> 0x20) + (int)((ulong)auVar58._0_8_ >> 0x20);
      uVar55 = auVar45._8_4_ + auVar58._8_4_;
      uVar56 = auVar53._12_4_ + auVar63._12_4_;
      iVar24 = iVar24 + uVar42;
      iVar25 = iVar25 + uVar54;
      iVar26 = iVar26 + uVar55;
      iVar27 = iVar27 + uVar56;
      uVar28 = uVar28 + uVar42;
      uVar29 = uVar29 + uVar54;
      uVar30 = uVar30 + uVar55;
      uVar31 = uVar31 + uVar56;
      uVar15 = uVar15 + 1;
      uVar18 = this->n_blocks - 1;
    } while (uVar15 < uVar18);
  }
  uVar15 = uVar18 >> 0x19;
  if ((uVar18 & 0x1ffffff) == 0) {
    ppVar7 = (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar4 = ppVar7 + uVar15;
    ppVar4->A = uVar28;
    ppVar4->C = uVar29;
    puVar1 = &ppVar7[uVar15].G;
    *puVar1 = uVar30;
    puVar1[1] = uVar31;
    iVar24 = 0;
    iVar25 = 0;
    iVar26 = 0;
    iVar27 = 0;
  }
  piVar2 = (int *)(this->data +
                  (ulong)(uint)((int)(uVar18 & 0x1ffffff) << 6) + 0x30 + uVar15 * 0x80000000);
  *piVar2 = iVar24;
  piVar2[1] = iVar25;
  piVar2[2] = iVar26;
  piVar2[3] = iVar27;
  return;
}

Assistant:

void build_rank_support(){

		p_rank superblock_r = {};
		p_rank block_r = {};

		for(uint64_t bl = 0; bl < n_blocks-1; ++bl){

			uint64_t superblock_number = bl/BLOCKS_PER_SUPERBLOCK;
			uint64_t block_number = bl%BLOCKS_PER_SUPERBLOCK;

			if(block_number == 0){

				superblock_ranks[superblock_number]=superblock_r;
				block_r = {};

			}

			set_counters(superblock_number, block_number,block_r);

			p_rank local_rank = block_rank(superblock_number, block_number);

			block_r = block_r + local_rank;
			superblock_r = superblock_r + local_rank;

		}

		uint64_t superblock_number = (n_blocks-1)/BLOCKS_PER_SUPERBLOCK;
		uint64_t block_number = (n_blocks-1)%BLOCKS_PER_SUPERBLOCK;

		if(block_number == 0){

			superblock_ranks[superblock_number]=superblock_r;
			block_r = {};

		}

		set_counters(superblock_number, block_number,block_r);

		assert(check_rank());

	}